

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O0

void opengv::relative_pose::modules::ge::getEV
               (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
               Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
               Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
               Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
               Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
               Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley,Vector4d *roots)

{
  double dVar1;
  double dVar2;
  Scalar SVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  Index in_R9;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *in_stack_00000008;
  double temp2;
  double temp1;
  double w;
  double y;
  double theta1;
  double theta2;
  double helper1;
  double q;
  double p;
  double alpha_pw3;
  double alpha_pw2;
  double gamma;
  double beta;
  double alpha;
  double B_pw4;
  double B_pw3;
  double B_pw2;
  double E;
  double D;
  double C;
  double B;
  double G23_2;
  double G13_2;
  double G12_2;
  double G03_2;
  double G02_2;
  double G01_2;
  Matrix4d G;
  Matrix3d *in_stack_00001ec0;
  Matrix3d *in_stack_00001ec8;
  Matrix3d *in_stack_00001ed0;
  Matrix3d *in_stack_00001ed8;
  Matrix3d *in_stack_00001ee0;
  Matrix3d *in_stack_00001ef8;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001f00;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001f08;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001f10;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001f18;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001f20;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001f28;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00001f30;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00001f38;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00001f40;
  cayley_t *in_stack_00001f48;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *this;
  
  composeG(in_stack_00001ee0,in_stack_00001ed8,in_stack_00001ed0,in_stack_00001ec8,in_stack_00001ec0
           ,in_stack_00001ef8,in_stack_00001f00,in_stack_00001f08,in_stack_00001f10,
           in_stack_00001f18,in_stack_00001f20,in_stack_00001f28,in_stack_00001f30,in_stack_00001f38
           ,in_stack_00001f40,in_stack_00001f48);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bad3);
  dVar13 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124baf6);
  dVar13 = dVar13 * *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bb22);
  dVar12 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bb45);
  dVar12 = dVar12 * *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bb71);
  dVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bb94);
  dVar1 = dVar1 * *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bbc1);
  dVar7 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bbe5);
  dVar7 = dVar7 * *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bc12);
  dVar8 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bc36);
  dVar8 = dVar8 * *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bc63);
  dVar9 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bc87);
  dVar9 = dVar9 * *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bcb2);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bceb);
  dVar11 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bd16);
  dVar2 = *pSVar4;
  this = in_stack_00000008;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (in_stack_00000008,in_R9,0x124bd40);
  dVar2 = ((-dVar10 - dVar11) - dVar2) - *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124bd94);
  SVar3 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124bdb6);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = -dVar9;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = SVar3;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar14,auVar56,auVar103);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124be01);
  SVar3 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124be23);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = (auVar14._0_8_ - dVar8) - dVar7;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = SVar3;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar15,auVar57,auVar104);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124be5c);
  SVar3 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124be7e);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = auVar14._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = SVar3;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar16,auVar58,auVar105);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124bed1);
  SVar3 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124bef3);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = ((auVar14._0_8_ - dVar1) - dVar12) - dVar13;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = SVar3;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar17,auVar59,auVar106);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124bf2b);
  SVar3 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124bf4d);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = auVar14._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = SVar3;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar18,auVar60,auVar107);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124bf85);
  SVar3 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124bfa7);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = auVar14._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = SVar3;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar19,auVar61,auVar108);
  dVar6 = auVar14._0_8_;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124bff2);
  SVar3 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c016);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c042);
  dVar11 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c06f);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = SVar3;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar8;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = -(dVar10 * 2.0 * dVar11 * *pSVar4);
  auVar14 = vfmadd213sd_fma(auVar20,auVar62,auVar109);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c0da);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = auVar14._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar7;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar21,auVar63,auVar110);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c113);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = auVar14._0_8_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *pSVar4;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar9;
  auVar14 = vfmadd213sd_fma(auVar22,auVar64,auVar111);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c14c);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c16e);
  dVar11 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c199);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = auVar14._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *pSVar4;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = -(dVar10 * dVar11);
  auVar14 = vfmadd213sd_fma(auVar23,auVar65,auVar112);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c1fb);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = auVar14._0_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar1;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar24,auVar66,auVar113);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c246);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = auVar14._0_8_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar1;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar25,auVar67,auVar114);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c280);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c2ab);
  dVar11 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c2d8);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = auVar14._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *pSVar4;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = -(dVar10 * 2.0 * dVar11);
  auVar14 = vfmadd213sd_fma(auVar26,auVar68,auVar115);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c33a);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = auVar14._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar12;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar27,auVar69,auVar116);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c385);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = auVar14._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar12;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar28,auVar70,auVar117);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c3bf);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c3ea);
  dVar11 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c417);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = auVar14._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *pSVar4;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = -(dVar10 * 2.0 * dVar11);
  auVar14 = vfmadd213sd_fma(auVar29,auVar71,auVar118);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c468);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c493);
  dVar11 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c4c0);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = auVar14._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *pSVar4;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = -(dVar10 * 2.0 * dVar11);
  auVar14 = vfmadd213sd_fma(auVar30,auVar72,auVar119);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c522);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = auVar14._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar13;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar31,auVar73,auVar120);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c56d);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = auVar14._0_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar13;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *pSVar4;
  auVar14 = vfmadd213sd_fma(auVar32,auVar74,auVar121);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c5a5);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = auVar14._0_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *pSVar4;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar9;
  auVar14 = vfmadd213sd_fma(auVar33,auVar75,auVar122);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c5dd);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c5ff);
  dVar11 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c62a);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = auVar14._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *pSVar4;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = -(dVar10 * dVar11);
  auVar14 = vfmadd213sd_fma(auVar34,auVar76,auVar123);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c679);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = auVar14._0_8_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *pSVar4;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar8;
  auVar14 = vfmadd213sd_fma(auVar35,auVar77,auVar124);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c6b1);
  auVar125._8_8_ = 0;
  auVar125._0_8_ = auVar14._0_8_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *pSVar4;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar7;
  auVar14 = vfmadd213sd_fma(auVar36,auVar78,auVar125);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c6e9);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c70b);
  dVar11 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c736);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = auVar14._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *pSVar4;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = -(dVar10 * dVar11);
  auVar14 = vfmadd213sd_fma(auVar37,auVar79,auVar126);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c785);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c7a7);
  dVar11 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c7d2);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = auVar14._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *pSVar4;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = -(dVar10 * dVar11);
  auVar14 = vfmadd213sd_fma(auVar38,auVar80,auVar127);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c858);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c883);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar7;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar1;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = -(dVar1 * dVar10 * *pSVar4);
  auVar15 = vfmadd213sd_fma(auVar39,auVar81,auVar128);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c8dd);
  dVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c908);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c935);
  dVar11 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c962);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = auVar15._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *pSVar4;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = -(dVar1 * 2.0 * dVar10 * dVar11);
  auVar15 = vfmadd213sd_fma(auVar40,auVar82,auVar129);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c9b3);
  dVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124c9de);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124ca09);
  dVar11 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124ca36);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = auVar15._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar1 * 2.0 * dVar10 * dVar11;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *pSVar4;
  auVar15 = vfmadd213sd_fma(auVar130,auVar41,auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar12;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar8;
  auVar15 = vfmadd213sd_fma(auVar42,auVar84,auVar15);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124ca98);
  dVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cac3);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = auVar15._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *pSVar4;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = -(dVar12 * dVar1);
  auVar15 = vfmadd213sd_fma(auVar43,auVar85,auVar131);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cb14);
  dVar12 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cb3f);
  dVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cb6c);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cb97);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = auVar15._0_8_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar12 * 2.0 * dVar1 * dVar10;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *pSVar4;
  auVar15 = vfmadd213sd_fma(auVar44,auVar86,auVar132);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cbd1);
  dVar12 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cbfc);
  dVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cc29);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cc56);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = auVar15._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *pSVar4;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = -(dVar12 * 2.0 * dVar1 * dVar10);
  auVar15 = vfmadd213sd_fma(auVar45,auVar87,auVar133);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cca7);
  dVar12 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124ccd2);
  dVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124ccff);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cd2c);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = auVar15._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *pSVar4;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = -(dVar12 * 2.0 * dVar1 * dVar10);
  auVar15 = vfmadd213sd_fma(auVar46,auVar88,auVar134);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cd7d);
  dVar12 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cda8);
  dVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cdd5);
  dVar10 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124ce00);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = auVar15._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar12 * 2.0 * dVar1 * dVar10;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *pSVar4;
  auVar15 = vfmadd213sd_fma(auVar135,auVar47,auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar13;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar9;
  auVar15 = vfmadd213sd_fma(auVar48,auVar90,auVar15);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124ce62);
  dVar12 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124ce8d);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = auVar15._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *pSVar4;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = -(dVar13 * dVar12);
  auVar15 = vfmadd213sd_fma(auVar49,auVar91,auVar136);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cedc);
  dVar13 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cf07);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = auVar15._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *pSVar4;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = -(dVar13 * dVar8);
  auVar15 = vfmadd213sd_fma(auVar50,auVar92,auVar137);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cf56);
  dVar13 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cf82);
  dVar12 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cfaf);
  dVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124cfdc);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = auVar15._0_8_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar13 * 2.0 * dVar12 * dVar1;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *pSVar4;
  auVar15 = vfmadd213sd_fma(auVar51,auVar93,auVar138);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124d014);
  dVar13 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124d03f);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = auVar15._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *pSVar4;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = -(dVar13 * dVar7);
  auVar15 = vfmadd213sd_fma(auVar52,auVar94,auVar139);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124d08e);
  dVar13 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124d0b0);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = auVar15._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar9;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = -(dVar13 * *pSVar4);
  auVar15 = vfmadd213sd_fma(auVar53,auVar95,auVar140);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124d108);
  dVar13 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124d12a);
  dVar12 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124d155);
  dVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     (this,in_R9,0x124d180);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = auVar15._0_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar13 * dVar12 * dVar1;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *pSVar4;
  auVar15 = vfmadd213sd_fma(auVar54,auVar96,auVar141);
  dVar12 = dVar2 * dVar2;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar12;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = dVar6;
  auVar16 = vfmadd213sd_fma(ZEXT816(0xbfd8000000000000),auVar97,auVar142);
  dVar7 = auVar16._0_8_;
  dVar13 = ((dVar12 * dVar2) / 8.0 - (dVar2 * dVar6) / 2.0) + auVar14._0_8_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar12 * dVar2 * dVar2;
  auVar143._0_8_ = (dVar12 * dVar6) / 16.0;
  auVar143._8_8_ = 0;
  auVar16 = vfmadd213sd_fma(ZEXT816(0xbf88000000000000),auVar98,auVar143);
  dVar12 = (auVar16._0_8_ - (dVar2 * auVar14._0_8_) / 4.0) + auVar15._0_8_;
  dVar1 = -(dVar7 * dVar7) / 12.0 - dVar12;
  dVar8 = pow(dVar13,2.0);
  dVar9 = pow(dVar1,3.0);
  dVar10 = pow(-dVar9 / 27.0,0.3333333333333333);
  dVar11 = sqrt(dVar10);
  dVar9 = sqrt(-dVar9 / 27.0);
  dVar12 = acos((-((-(dVar7 * dVar7 * dVar7) / 108.0 + (dVar7 * dVar12) / 3.0) - dVar8 / 8.0) / 2.0)
                / dVar9);
  dVar12 = cos(dVar12 * 0.3333333333333333);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar7;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar11 * dVar12;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = dVar1 * 0.3333333333333333;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = -(dVar11 * dVar12 * dVar10);
  auVar14 = vfmadd213sd_fma(auVar55,auVar144,auVar149);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = -(auVar14._0_8_ / dVar10);
  auVar14 = vfmadd213sd_fma(ZEXT816(0xbfeaaaaaaaaaaaab),auVar99,auVar145);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = dVar7;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = auVar14._0_8_;
  auVar15 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar100,auVar146);
  dVar12 = sqrt(auVar15._0_8_);
  auVar147._0_8_ = -dVar2 / 4.0;
  auVar147._8_8_ = 0;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar12;
  auVar15 = vfmadd213sd_fma(ZEXT816(0xbfe0000000000000),auVar101,auVar147);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar7;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = -(auVar14._0_8_ * 2.0);
  auVar14 = vfmadd213sd_fma(ZEXT816(0xc008000000000000),auVar102,auVar148);
  dVar13 = sqrt(auVar14._0_8_ + (dVar13 * 2.0) / dVar12);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this,in_R9);
  *pSVar5 = auVar15._0_8_ + dVar13 * 0.5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this,in_R9);
  *pSVar5 = auVar15._0_8_ - dVar13 * 0.5;
  return;
}

Assistant:

void
opengv::relative_pose::modules::ge::getEV(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & cayley,
    Eigen::Vector4d & roots )
{
  Eigen::Matrix4d G = composeG(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley);
  
  // now compute the roots in closed-form
  //double G00_2 = G(0,0) * G(0,0);
  double G01_2 = G(0,1) * G(0,1);
  double G02_2 = G(0,2) * G(0,2);
  double G03_2 = G(0,3) * G(0,3);
  //double G11_2 = G(1,1) * G(1,1);
  double G12_2 = G(1,2) * G(1,2);
  double G13_2 = G(1,3) * G(1,3);
  //double G22_2 = G(2,2) * G(2,2);
  double G23_2 = G(2,3) * G(2,3);
  //double G33_2 = G(3,3) * G(3,3);
  
  double B = -G(3,3)-G(2,2)-G(1,1)-G(0,0);
  double C = -G23_2+G(2,2)*G(3,3)-G13_2-G12_2+G(1,1)*G(3,3)+G(1,1)*G(2,2)-G03_2-G02_2-G01_2+G(0,0)*G(3,3)+G(0,0)*G(2,2)+G(0,0)*G(1,1);
  double D = G13_2*G(2,2)-2.0*G(1,2)*G(1,3)*G(2,3)+G12_2*G(3,3)+G(1,1)*G23_2-G(1,1)*G(2,2)*G(3,3)+G03_2*G(2,2)+G03_2*G(1,1)-2.0*G(0,2)*G(0,3)*G(2,3)+G02_2*G(3,3)+G02_2*G(1,1)-2.0*G(0,1)*G(0,3)*G(1,3)-2.0*G(0,1)*G(0,2)*G(1,2)+G01_2*G(3,3)+G01_2*G(2,2)+G(0,0)*G23_2-G(0,0)*G(2,2)*G(3,3)+G(0,0)*G13_2+G(0,0)*G12_2-G(0,0)*G(1,1)*G(3,3)-G(0,0)*G(1,1)*G(2,2);
  double E = G03_2*G12_2-G03_2*G(1,1)*G(2,2)-2.0*G(0,2)*G(0,3)*G(1,2)*G(1,3)+2.0*G(0,2)*G(0,3)*G(1,1)*G(2,3)+G02_2*G13_2-G02_2*G(1,1)*G(3,3)+2.0*G(0,1)*G(0,3)*G(1,3)*G(2,2)-2.0*G(0,1)*G(0,3)*G(1,2)*G(2,3)-2.0*G(0,1)*G(0,2)*G(1,3)*G(2,3)+2.0*G(0,1)*G(0,2)*G(1,2)*G(3,3)+G01_2*G23_2-G01_2*G(2,2)*G(3,3)-G(0,0)*G13_2*G(2,2)+2.0*G(0,0)*G(1,2)*G(1,3)*G(2,3)-G(0,0)*G12_2*G(3,3)-G(0,0)*G(1,1)*G23_2+G(0,0)*G(1,1)*G(2,2)*G(3,3);

  double B_pw2 = B*B;
  double B_pw3 = B_pw2*B;
  double B_pw4 = B_pw3*B;
  double alpha = -0.375*B_pw2+C;
  double beta = B_pw3/8.0-B*C/2.0+D;
  double gamma = -0.01171875*B_pw4+B_pw2*C/16.0-B*D/4.0+E;
  double alpha_pw2 = alpha*alpha;
  double alpha_pw3 = alpha_pw2*alpha;
  double p = -alpha_pw2/12.0-gamma;
  double q = -alpha_pw3/108.0+alpha*gamma/3.0-pow(beta,2.0)/8.0;
  double helper1 = -pow(p,3.0)/27.0;
  double theta2 = pow( helper1, (1.0/3.0) );
  double theta1 = sqrt(theta2) * cos( (1.0/3.0) * acos( (-q/2.0) / sqrt(helper1) ) );
  double y = -(5.0/6.0)*alpha - ( (1.0/3.0) * p * theta1 - theta1 * theta2) / theta2;
  double w = sqrt(alpha+2.0*y);
  
  //we currently disable the computation of all other roots, they are not used
  //roots[0] = -B/4.0 + 0.5*w + 0.5*sqrt(-3.0*alpha-2.0*y-2.0*beta/w);
  //roots[1] = -B/4.0 + 0.5*w - 0.5*sqrt(-3.0*alpha-2.0*y-2.0*beta/w);
  double temp1 = -B/4.0 - 0.5*w;
  double temp2 = 0.5*sqrt(-3.0*alpha-2.0*y+2.0*beta/w);
  //roots[2] = -B/4.0 - 0.5*w + 0.5*sqrt(-3.0*alpha-2.0*y+2.0*beta/w);
  //roots[3] = -B/4.0 - 0.5*w - 0.5*sqrt(-3.0*alpha-2.0*y+2.0*beta/w); //this is the smallest one!
  roots[2] = temp1 + temp2;
  roots[3] = temp1 - temp2;
}